

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_420.cpp
# Opt level: O3

int __thiscall YUV420::ReadFromYUVFile(YUV420 *this,string *filename)

{
  uint8_t *puVar1;
  double dVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  uint8_t temp;
  ifstream infile;
  uint8_t local_279;
  uint8_t *local_278;
  size_t local_270;
  long local_268;
  ulong local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  char local_238 [520];
  
  local_270 = this->width_;
  puVar1 = this->y_;
  puVar11 = this->u_;
  local_278 = this->v_;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in|_S_bin|_S_ate);
  cVar4 = std::__basic_file<char>::is_open();
  iVar10 = -1;
  if (cVar4 != '\0') {
    local_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_invoke;
    local_258._8_8_ = 0;
    local_248 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_manager;
    local_258._M_unused._M_object = local_238;
    lVar5 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    lVar6 = std::istream::tellg();
    auVar12._8_8_ = 0;
    auVar12._0_8_ = this->size_;
    auVar12 = vpunpckldq_avx(auVar12,_DAT_001411b0);
    auVar12 = vsubpd_avx(auVar12,_DAT_001411c0);
    dVar2 = (auVar12._0_8_ + auVar12._8_8_) * 1.5;
    uVar7 = (ulong)dVar2;
    if (lVar5 - lVar6 != ((long)(dVar2 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7)) {
      __assert_fail("fsize == static_cast<size_t>(1.5 * size_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp"
                    ,0x20,"int YUV420::ReadFromYUVFile(const string &)");
    }
    std::istream::read(local_238,(long)puVar1);
    uVar7 = this->height_;
    if (uVar7 != 0) {
      uVar8 = this->width_;
      puVar11 = puVar11 + 1;
      local_268 = local_270 * 2;
      uVar9 = 0;
      do {
        sVar3 = local_270;
        local_260 = uVar9;
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          uVar7 = 0;
          do {
            std::istream::read(local_238,(long)&local_279);
            puVar11[uVar7 + sVar3] = local_279;
            puVar11[uVar7] = local_279;
            puVar11[uVar7 + (sVar3 - 1)] = local_279;
            puVar11[uVar7 - 1] = local_279;
            uVar7 = uVar7 + 2;
            uVar8 = this->width_;
          } while (uVar7 < uVar8);
          uVar7 = this->height_;
        }
        uVar9 = local_260 + 2;
        puVar11 = puVar11 + local_268;
      } while (uVar9 < uVar7);
      if (uVar7 != 0) {
        uVar8 = this->width_;
        local_278 = local_278 + 1;
        uVar9 = 0;
        do {
          sVar3 = local_270;
          puVar1 = local_278;
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            uVar7 = 0;
            do {
              std::istream::read(local_238,(long)&local_279);
              puVar1[uVar7 + sVar3] = local_279;
              local_278[uVar7] = local_279;
              puVar1[uVar7 + (sVar3 - 1)] = local_279;
              local_278[uVar7 - 1] = local_279;
              uVar7 = uVar7 + 2;
              uVar8 = this->width_;
            } while (uVar7 < uVar8);
            uVar7 = this->height_;
          }
          uVar9 = uVar9 + 2;
          local_278 = local_278 + local_268;
        } while (uVar9 < uVar7);
      }
    }
    DeferredAction::~DeferredAction((DeferredAction *)&local_258);
    iVar10 = 0;
  }
  std::ifstream::~ifstream(local_238);
  return iVar10;
}

Assistant:

int YUV420::ReadFromYUVFile(const string &filename) {
  auto y = reinterpret_cast<uint8_t (*)[width_]>(y_);
  auto u = reinterpret_cast<uint8_t (*)[width_]>(u_);
  auto v = reinterpret_cast<uint8_t (*)[width_]>(v_);

  std::ifstream infile(filename, std::ifstream::in | std::ifstream::binary | std::ifstream::ate);
  if (!infile.is_open()){ return -1;}
  DEFER({infile.close();});

  std::streampos fsize = infile.tellg();
  infile.seekg(0, std::ifstream::beg);
  fsize = fsize - infile.tellg();
  assert(fsize == static_cast<size_t>(1.5 * size_));

  infile.read(reinterpret_cast<char *>(y), size_);
  for(size_t i = 0; i < height_; i+=2){
    for(size_t j = 0; j < width_; j+=2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      u[i][j] = u[i + 1][j] = u[i][j + 1] = u[i + 1][j + 1] = temp;
    }
  }

  for(size_t i = 0; i < height_; i += 2){
    for(size_t j = 0; j < width_; j += 2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      v[i][j] = v[i + 1][j] = v[i][j + 1] = v[i + 1][j + 1] = temp;
    }
  }
  return 0;
}